

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Damage(NPC *this,Character *from,int amount,int spell_id)

{
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_00;
  World *pWVar1;
  long *plVar2;
  Character *this_01;
  PacketFamily family;
  bool bVar3;
  int iVar4;
  int iVar5;
  mapped_type *this_02;
  ENF_Data *pEVar6;
  int iVar7;
  _List_node_base *p_Var8;
  list<Character_*,_std::allocator<Character_*>_> *plVar9;
  double dVar10;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> opponent;
  PacketBuilder builder;
  
  iVar4 = this->hp;
  if (amount <= this->hp) {
    iVar4 = amount;
  }
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"LimitDamage",(allocator<char> *)&opponent);
  this_02 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,(key_type *)&builder);
  bVar3 = util::variant::GetBool(this_02);
  std::__cxx11::string::~string((string *)&builder);
  if (bVar3) {
    amount = iVar4;
  }
  pEVar6 = ENF(this);
  if (pEVar6->type != Passive) {
    pEVar6 = ENF(this);
    iVar7 = 0;
    iVar5 = 0;
    if (pEVar6->type != Aggressive) goto LAB_00161ac5;
  }
  iVar7 = this->hp - iVar4;
  iVar5 = amount;
LAB_00161ac5:
  this->hp = iVar7;
  iVar7 = this->totaldamage + iVar4;
  if (this->totaldamage < iVar7) {
    this->totaldamage = iVar7;
  }
  opponent._M_t.super___uniq_ptr_impl<NPC_Opponent,_std::default_delete<NPC_Opponent>_>._M_t.
  super__Tuple_impl<0UL,_NPC_Opponent_*,_std::default_delete<NPC_Opponent>_>.
  super__Head_base<0UL,_NPC_Opponent_*,_false>._M_head_impl =
       (__uniq_ptr_data<NPC_Opponent,_std::default_delete<NPC_Opponent>,_true,_true>)
       operator_new(0x18);
  this_00 = &this->damagelist;
  bVar3 = false;
  p_Var8 = (_List_node_base *)this_00;
  while (p_Var8 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)this_00) {
    plVar2 = *(long **)(p_Var8 + 1);
    if ((Character *)*plVar2 == from) {
      iVar7 = (int)plVar2[1] + iVar4;
      if ((int)plVar2[1] < iVar7) {
        *(int *)(plVar2 + 1) = iVar7;
      }
      dVar10 = Timer::GetTime();
      *(double *)(*(long *)(p_Var8 + 1) + 0x10) = dVar10;
      bVar3 = true;
    }
  }
  if (!bVar3) {
    *(Character **)
     opponent._M_t.super___uniq_ptr_impl<NPC_Opponent,_std::default_delete<NPC_Opponent>_>._M_t.
     super__Tuple_impl<0UL,_NPC_Opponent_*,_std::default_delete<NPC_Opponent>_>.
     super__Head_base<0UL,_NPC_Opponent_*,_false>._M_head_impl = from;
    *(int *)((long)opponent._M_t.
                   super___uniq_ptr_impl<NPC_Opponent,_std::default_delete<NPC_Opponent>_>._M_t.
                   super__Tuple_impl<0UL,_NPC_Opponent_*,_std::default_delete<NPC_Opponent>_>.
                   super__Head_base<0UL,_NPC_Opponent_*,_false>._M_head_impl + 8) = iVar4;
    dVar10 = Timer::GetTime();
    *(double *)
     ((long)opponent._M_t.super___uniq_ptr_impl<NPC_Opponent,_std::default_delete<NPC_Opponent>_>.
            _M_t.super__Tuple_impl<0UL,_NPC_Opponent_*,_std::default_delete<NPC_Opponent>_>.
            super__Head_base<0UL,_NPC_Opponent_*,_false>._M_head_impl + 0x10) = dVar10;
    builder._0_8_ = this;
    std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::push_back
              ((list<NPC_*,_std::allocator<NPC_*>_> *)
               (*(long *)opponent._M_t.
                         super___uniq_ptr_impl<NPC_Opponent,_std::default_delete<NPC_Opponent>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_NPC_Opponent_*,_std::default_delete<NPC_Opponent>_>.
                         super__Head_base<0UL,_NPC_Opponent_*,_false>._M_head_impl + 0x378),
               (value_type *)&builder);
    std::__cxx11::
    list<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>,std::allocator<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>>
    ::emplace_back<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>
              ((list<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>,std::allocator<std::unique_ptr<NPC_Opponent,std::default_delete<NPC_Opponent>>>>
                *)this_00,&opponent);
  }
  if (this->hp < 1) {
    Killed(this,from,iVar5,spell_id);
  }
  else {
    family = PACKET_CAST;
    if (spell_id == -1) {
      family = PACKET_NPC;
    }
    PacketBuilder::PacketBuilder(&builder,family,PACKET_REPLY,0xe);
    if (spell_id != -1) {
      PacketBuilder::AddShort(&builder,spell_id);
    }
    iVar4 = Character::PlayerID(from);
    PacketBuilder::AddShort(&builder,iVar4);
    PacketBuilder::AddChar(&builder,(uint)from->direction);
    PacketBuilder::AddShort(&builder,(uint)this->index);
    PacketBuilder::AddThree(&builder,iVar5);
    iVar4 = this->hp;
    pEVar6 = ENF(this);
    iVar5 = (int)(((double)iVar4 / (double)pEVar6->hp) * 100.0);
    iVar4 = 0;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar5 = 100;
    if (iVar4 < 100) {
      iVar5 = iVar4;
    }
    PacketBuilder::AddShort(&builder,iVar5);
    if (spell_id == -1) {
      PacketBuilder::AddChar(&builder,1);
    }
    else {
      PacketBuilder::AddShort(&builder,from->tp);
    }
    plVar9 = &this->map->characters;
    p_Var8 = (_List_node_base *)plVar9;
    while (p_Var8 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var8->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)plVar9) {
      this_01 = (Character *)p_Var8[1]._M_next;
      bVar3 = Character::InRange(this_01,this);
      if (bVar3) {
        Character::Send(this_01,&builder);
      }
    }
    PacketBuilder::~PacketBuilder(&builder);
  }
  std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::~unique_ptr(&opponent);
  return;
}

Assistant:

void NPC::Damage(Character *from, int amount, int spell_id)
{
	int limitamount = std::min(this->hp, amount);

	if (this->map->world->config["LimitDamage"])
	{
		amount = limitamount;
	}

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		this->hp -= limitamount;
	}
	else
	{
		this->hp = 0;
		amount = 0;
	}

	if (this->totaldamage + limitamount > this->totaldamage)
		this->totaldamage += limitamount;

	std::unique_ptr<NPC_Opponent> opponent(new NPC_Opponent);
	bool found = false;

	UTIL_FOREACH_CREF(this->damagelist, checkopp)
	{
		if (checkopp->attacker == from)
		{
			found = true;

			if (checkopp->damage + limitamount > checkopp->damage)
				checkopp->damage += limitamount;

			checkopp->last_hit = Timer::GetTime();
		}
	}

	if (!found)
	{
		opponent->attacker = from;
		opponent->damage = limitamount;
		opponent->last_hit = Timer::GetTime();
		opponent->attacker->unregister_npc.push_back(this);
		this->damagelist.emplace_back(std::move(opponent));
	}

	if (this->hp > 0)
	{
		PacketBuilder builder(spell_id == -1 ? PACKET_NPC : PACKET_CAST, PACKET_REPLY, 14);

		if (spell_id != -1)
			builder.AddShort(spell_id);

		builder.AddShort(from->PlayerID());
		builder.AddChar(from->direction);
		builder.AddShort(this->index);
		builder.AddThree(amount);
		builder.AddShort(util::clamp<int>(double(this->hp) / double(this->ENF().hp) * 100.0, 0, 100));

		if (spell_id != -1)
			builder.AddShort(from->tp);
		else
			builder.AddChar(1); // ?

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}
	else
	{
		this->Killed(from, amount, spell_id);
		// *this may not be valid here
		return;
	}
}